

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetDevWarningsAsErrors(cmake *this,bool b)

{
  allocator<char> local_69;
  string local_68;
  undefined1 local_38 [8];
  string value;
  bool b_local;
  cmake *this_local;
  
  value.field_2._M_local_buf[0xf] = b;
  std::__cxx11::string::string((string *)local_38);
  if ((value.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::operator=((string *)local_38,"TRUE");
  }
  else {
    std::__cxx11::string::operator=((string *)local_38,"FALSE");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_69);
  AddCacheEntry(this,&local_68,(string *)local_38,
                "Suppress errors that are meant for the author of the CMakeLists.txt files.",4);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmake::SetDevWarningsAsErrors(bool b)
{
  std::string value;

  // equivalent to -Werror=dev
  if (b) {
    value = "FALSE";
  }
  // equivalent to -Wno-error=dev
  else {
    value = "TRUE";
  }

  this->AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_ERRORS", value,
                      "Suppress errors that are meant for"
                      " the author of the CMakeLists.txt files.",
                      cmStateEnums::INTERNAL);
}